

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

Allocation __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
::inplace_allocate<0ul,true>
          (heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
           *this,size_t i_size,size_t i_alignment)

{
  void *pvVar1;
  ulong uVar2;
  uintptr_t uint_pointer_3;
  uintptr_t uint_pointer;
  ControlBlock *pCVar3;
  ulong i_size_00;
  size_t i_alignment_00;
  Allocation AVar4;
  
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xa8c);
  }
  i_alignment_00 = 8;
  if (8 < i_alignment) {
    i_alignment_00 = i_alignment;
  }
  i_size_00 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    i_size_00 = i_size;
  }
  while( true ) {
    pCVar3 = *(ControlBlock **)(this + 8);
    if (pCVar3 != (ControlBlock *)0xffef && ((ulong)pCVar3 & 7) != 0) {
      density_tests::detail::assert_failed<>
                ("address_is_aligned(m_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0xa98);
      pCVar3 = *(ControlBlock **)(this + 8);
    }
    pvVar1 = address_upper_align(pCVar3 + 2,i_alignment_00);
    AVar4.m_user_storage = pvVar1;
    AVar4.m_control_block = pCVar3;
    uVar2 = (long)pvVar1 + i_size_00;
    if (uVar2 <= ((ulong)pCVar3 & 0xffffffffffff0000 | 0xffe8)) break;
    if (0xffd8 < (i_alignment_00 + i_size_00) - 8) {
      AVar4 = external_allocate<0ul>(this,i_size_00,i_alignment_00);
      return AVar4;
    }
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::allocate_new_page((heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                         *)this);
  }
  pCVar3->m_next = uVar2;
  *(ulong *)(this + 8) = uVar2;
  return AVar4;
}

Assistant:

Allocation inplace_allocate(size_t i_size, size_t i_alignment)
        {
            DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

            if (i_alignment < min_alignment)
            {
                i_alignment = min_alignment;
                i_size      = uint_upper_align(i_size, min_alignment);
            }

            for (;;)
            {
                DENSITY_ASSERT_INTERNAL(
                  address_is_aligned(m_tail, min_alignment) ||
                  m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));

                // allocate space for the control block and the runtime type
                auto const control_block = m_tail;
                void *     new_tail      = address_add(
                  control_block,
                  INCLUDE_TYPE ? (s_sizeof_ControlBlock + s_sizeof_RuntimeType)
                               : s_sizeof_ControlBlock);

                // allocate space for the element
                new_tail                  = address_upper_align(new_tail, i_alignment);
                void * const user_storage = new_tail;
                new_tail                  = address_add(new_tail, i_size);

                // check if a page overflow would occur
                void * end_of_page = get_end_of_page(control_block);
                if (DENSITY_LIKELY(new_tail <= end_of_page))
                {
                    DENSITY_ASSUME(control_block != nullptr);
                    new (control_block) ControlBlock();

                    control_block->m_next = reinterpret_cast<uintptr_t>(new_tail) + CONTROL_BITS;
                    m_tail                = static_cast<ControlBlock *>(new_tail);
                    return Allocation{control_block, user_storage};
                }
                else if (
                  i_size + (i_alignment - min_alignment) <=
                  s_max_size_inpage) // if this allocation may fit in a page
                {
                    // allocate a new page and redo
                    allocate_new_page();
                }
                else
                {
                    // this allocation would never fit in a page, allocate an external block
                    return external_allocate<CONTROL_BITS>(i_size, i_alignment);
                }
            }
        }